

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::CleanupWindowContour(ProjectedWindowContour *window)

{
  pointer paVar1;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  IfcVector2 *pip;
  pointer paVar2;
  double dVar3;
  ExPolygons clipped;
  Polygon subject;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> scratch;
  IntPoint local_100;
  Clipper clipper;
  
  scratch.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scratch.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scratch.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  subject.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ClipperLib::Clipper::Clipper(&clipper);
  clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = (window->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar2 = (window->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start; paVar2 != paVar1; paVar2 = paVar2 + 1) {
    dVar3 = paVar2->x * 1518500249.0;
    local_100.X = (long64)dVar3;
    local_100.X = (long)(dVar3 - 9.223372036854776e+18) & local_100.X >> 0x3f | local_100.X;
    dVar3 = paVar2->y * 1518500249.0;
    local_100.Y = (long64)dVar3;
    local_100.Y = (long)(dVar3 - 9.223372036854776e+18) & local_100.Y >> 0x3f | local_100.Y;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(&subject,&local_100);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper._vptr_Clipper),&subject,
             ptSubject);
  ClipperLib::Clipper::Execute(&clipper,ctUnion,&clipped,pftNonZero,pftNonZero);
  if ((long)clipped.
            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)clipped.
            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x30) {
    if (clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        clipped.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5055e8);
      paVar2 = (window->contour).
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((window->contour).
          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish != paVar2) {
        (window->contour).
        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paVar2;
      }
      goto LAB_005055a4;
    }
    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x505594);
  }
  ExtractVerticesFromClipper
            (&(clipped.
               super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
               _M_impl.super__Vector_impl_data._M_start)->outer,&scratch,false);
LAB_005055a4:
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&clipped);
  ClipperLib::Clipper::~Clipper(&clipper);
  std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
            (&subject.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
  std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
            (&scratch.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
  return;
}

Assistant:

void CleanupWindowContour(ProjectedWindowContour& window)
{
    std::vector<IfcVector2> scratch;
    std::vector<IfcVector2>& contour = window.contour;

    ClipperLib::Polygon subject;
    ClipperLib::Clipper clipper;
    ClipperLib::ExPolygons clipped;

    for(const IfcVector2& pip : contour) {
        subject.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    clipper.AddPolygon(subject,ClipperLib::ptSubject);
    clipper.Execute(ClipperLib::ctUnion,clipped,ClipperLib::pftNonZero,ClipperLib::pftNonZero);

    // This should yield only one polygon or something went wrong
    if (clipped.size() != 1) {

        // Empty polygon? drop the contour altogether
        if(clipped.empty()) {
            IFCImporter::LogError("error during polygon clipping, window contour is degenerate");
            window.FlagInvalid();
            return;
        }

        // Else: take the first only
        IFCImporter::LogError("error during polygon clipping, window contour is not convex");
    }

    ExtractVerticesFromClipper(clipped[0].outer, scratch);
    // Assume the bounding box doesn't change during this operation
}